

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_translateCycArray(RDL_data *data,RDL_cycle **array,uint number,char ***ptr)

{
  RDL_edge *paRVar1;
  uint uVar2;
  char **ppcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    number = 0xffffffff;
  }
  else {
    if (number != 0) {
      ppcVar3 = RDL_alloc2DCharArray(number,data->graph->E);
      for (uVar4 = 0; uVar4 != number; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar5 < data->graph->E; uVar5 = uVar5 + 1) {
          ppcVar3[uVar4][uVar5] = '\0';
        }
      }
      for (uVar4 = 0; uVar4 != number; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar5 < array[uVar4]->weight; uVar5 = uVar5 + 1) {
          paRVar1 = array[uVar4]->edges;
          uVar2 = RDL_edgeId(data->graph,paRVar1[uVar5][0],paRVar1[uVar5][1]);
          ppcVar3[uVar4][uVar2] = '\x01';
        }
      }
      goto LAB_00105b5a;
    }
    number = 0;
  }
  ppcVar3 = RDL_alloc2DCharArray(0,0);
LAB_00105b5a:
  *ptr = ppcVar3;
  return number;
}

Assistant:

unsigned RDL_translateCycArray(const RDL_data *data, RDL_cycle **array,
                               unsigned number, char ***ptr)
{
  unsigned i,j,RDL_edgeIdx;
  char **result;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return RDL_INVALID_RESULT;
  }

  if (number < 1) {
    (*ptr) = RDL_alloc2DCharArray(0, 0);
    return 0;
  }

  result = RDL_alloc2DCharArray(number, data->graph->E);
  for(i=0; i<number;  ++i)/*initialize to 0s*/
  {
    for(j=0; j<data->graph->E; ++j)
    {
      result[i][j] = 0;
    }
  }

  for(i=0; i<number; ++i)
  {
    for(j=0; j<array[i]->weight; ++j)
    {
      RDL_edgeIdx = RDL_edgeId(data->graph, array[i]->edges[j][0],
                               array[i]->edges[j][1]);
      result[i][RDL_edgeIdx] = 1;
    }
  }
  (*ptr) = result;
  return number;
}